

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

ZSTD_frameSizeInfo *
ZSTD_findFrameSizeInfo(ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize)

{
  ZSTD_frameSizeInfo *pZVar1;
  size_t sVar2;
  undefined1 *src_00;
  ZSTD_frameSizeInfo *srcSize_00;
  bool bVar3;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_6c;
  ZSTD_frameHeader local_60;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    local_60.frameContentSize = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      pZVar1 = (ZSTD_frameSizeInfo *)((ulong)*(uint *)((long)src + 4) + 8);
      local_60.frameContentSize = (unsigned_long_long)(ZSTD_frameSizeInfo *)0xffffffffffffffb8;
      if (pZVar1 <= srcSize) {
        local_60.frameContentSize = (unsigned_long_long)pZVar1;
      }
      if (srcSize < local_60.frameContentSize &&
          local_60.frameContentSize < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
        __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x2e7,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
      }
    }
    pZVar1 = (ZSTD_frameSizeInfo *)0x0;
    __return_storage_ptr__->nbBlocks = 0;
    __return_storage_ptr__->compressedSize = local_60.frameContentSize;
LAB_00213d16:
    __return_storage_ptr__->decompressedBound = (unsigned_long_long)pZVar1;
    return (ZSTD_frameSizeInfo *)local_60.frameContentSize;
  }
  pZVar1 = (ZSTD_frameSizeInfo *)ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
  if (pZVar1 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
    if (pZVar1 != (ZSTD_frameSizeInfo *)0x0) {
LAB_00213d3c:
      __return_storage_ptr__->compressedSize = 0xffffffffffffffb8;
      goto LAB_00213da8;
    }
    src_00 = (undefined1 *)((long)src + (ulong)local_60.headerSize);
    srcSize_00 = (ZSTD_frameSizeInfo *)(srcSize - local_60.headerSize);
    pZVar1 = (ZSTD_frameSizeInfo *)ZSTD_getcBlockSize(src_00,(size_t)srcSize_00,&local_6c);
    if (pZVar1 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
      sVar2 = 1;
      do {
        pZVar1 = (ZSTD_frameSizeInfo *)((long)&pZVar1->nbBlocks + 3);
        bVar3 = srcSize_00 < pZVar1;
        srcSize_00 = (ZSTD_frameSizeInfo *)((long)srcSize_00 - (long)pZVar1);
        if (bVar3) {
          pZVar1 = (ZSTD_frameSizeInfo *)0xffffffffffffffb8;
          break;
        }
        src_00 = src_00 + (long)pZVar1;
        if (local_6c.lastBlock != 0) {
          if (local_60.checksumFlag != 0) {
            if (srcSize_00 < (ZSTD_frameSizeInfo *)0x4) goto LAB_00213d3c;
            src_00 = src_00 + 4;
          }
          pZVar1 = (ZSTD_frameSizeInfo *)(local_60.blockSizeMax * sVar2);
          if ((ZSTD_frameSizeInfo *)local_60.frameContentSize !=
              (ZSTD_frameSizeInfo *)0xffffffffffffffff) {
            pZVar1 = (ZSTD_frameSizeInfo *)local_60.frameContentSize;
          }
          __return_storage_ptr__->nbBlocks = sVar2;
          __return_storage_ptr__->compressedSize = (long)src_00 - (long)src;
          goto LAB_00213d16;
        }
        pZVar1 = (ZSTD_frameSizeInfo *)ZSTD_getcBlockSize(src_00,(size_t)srcSize_00,&local_6c);
        sVar2 = sVar2 + 1;
      } while (pZVar1 < (ZSTD_frameSizeInfo *)0xffffffffffffff89);
    }
  }
  __return_storage_ptr__->compressedSize = (size_t)pZVar1;
LAB_00213da8:
  __return_storage_ptr__->decompressedBound = 0xfffffffffffffffe;
  return pZVar1;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}